

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dice.cpp
# Opt level: O2

vector<double,_std::allocator<double>_> * __thiscall
DiceRoller::getPercentages
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,DiceRoller *this)

{
  int *piVar1;
  double in_RAX;
  vector<double,_std::allocator<double>_> *__x;
  int *piVar2;
  double local_38;
  
  local_38 = in_RAX;
  __x = (vector<double,_std::allocator<double>_> *)operator_new(0x18);
  (__x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  piVar1 = (this->history->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (piVar2 = (this->history->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start; piVar2 != piVar1; piVar2 = piVar2 + 1) {
    local_38 = (double)*piVar2 / (double)*this->diceRolled;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>(__x,&local_38);
  }
  std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__,__x);
  return __return_storage_ptr__;
}

Assistant:

std::vector<double> DiceRoller::getPercentages() {
    auto* percentages = new std::vector<double>();

    for (int x : *history) {
        percentages->push_back((double) x / (double) *diceRolled);
    }

    return *percentages;
}